

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O0

void __thiscall perlin::perlin(perlin *this)

{
  vec3 v;
  vec3 *pvVar1;
  int *piVar2;
  double in_stack_ffffffffffffff80;
  vec3 *local_58;
  undefined8 local_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  double local_28;
  int local_20;
  int i;
  perlin *this_local;
  
  pvVar1 = (vec3 *)operator_new__(0x1800);
  local_58 = pvVar1;
  do {
    vec3::vec3(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != pvVar1 + 0x100);
  this->ranvec = pvVar1;
  for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
    vec3::random();
    v.e[1] = (double)local_40;
    v.e[0] = (double)local_48;
    v.e[2] = in_stack_ffffffffffffff80;
    unit_vector(v);
    pvVar1 = this->ranvec + local_20;
    pvVar1->e[0] = local_38;
    pvVar1->e[1] = local_30;
    pvVar1->e[2] = local_28;
  }
  piVar2 = perlin_generate_perm();
  this->perm_x = piVar2;
  piVar2 = perlin_generate_perm();
  this->perm_y = piVar2;
  piVar2 = perlin_generate_perm();
  this->perm_z = piVar2;
  return;
}

Assistant:

perlin() {
        ranvec = new vec3[point_count];
        for (int i = 0; i < point_count; ++i) {
            ranvec[i] = unit_vector(vec3::random(-1, 1));
        }

        perm_x = perlin_generate_perm();
        perm_y = perlin_generate_perm();
        perm_z = perlin_generate_perm();
    }